

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler::id_is_phi_variable
          (AnalyzeVariableScopeAccessHandler *this,uint32_t id)

{
  ulong uVar1;
  Variant *pVVar2;
  SPIRVariable *pSVar3;
  ulong uVar4;
  
  uVar1 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.buffer_size;
  if (id < (uint)uVar1) {
    uVar4 = (ulong)id;
    if ((uVar4 < uVar1) &&
       (pVVar2 = (this->compiler->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr,
       pVVar2[uVar4].type == TypeVariable)) {
      pSVar3 = Variant::get<diligent_spirv_cross::SPIRVariable>(pVVar2 + uVar4);
    }
    else {
      pSVar3 = (SPIRVariable *)0x0;
    }
    if (pSVar3 != (SPIRVariable *)0x0) {
      return pSVar3->phi_variable;
    }
  }
  return false;
}

Assistant:

bool Compiler::AnalyzeVariableScopeAccessHandler::id_is_phi_variable(uint32_t id) const
{
	if (id >= compiler.get_current_id_bound())
		return false;
	auto *var = compiler.maybe_get<SPIRVariable>(id);
	return var && var->phi_variable;
}